

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

bool __thiscall
stackjit::ExecutionEngine::loadAssembly
          (ExecutionEngine *this,string *filePath,AssemblyType assemblyType)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  Assembly assembly;
  ifstream fileStream;
  allocator local_2a1;
  string local_2a0;
  Assembly local_280;
  ifstream local_230 [520];
  
  lVar2 = std::__cxx11::string::find((char *)filePath,0x17e52d);
  std::ifstream::ifstream(local_230,(string *)filePath,(uint)(lVar2 == -1) * 4 + _S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Could not load the assembly \'");
    poVar3 = std::operator<<(poVar3,(string *)filePath);
    poVar3 = std::operator<<(poVar3,"\'.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else if (lVar2 == -1) {
    pcVar4 = "library";
    if (assemblyType == Program) {
      pcVar4 = "program";
    }
    std::__cxx11::string::string((string *)&local_2a0,pcVar4,&local_2a1);
    Loader::Assembly::Assembly(&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    Loader::load((istream *)local_230,&local_280);
    loadAssembly(this,&local_280,assemblyType);
    Loader::Assembly::~Assembly(&local_280);
  }
  else {
    loadImage(this,local_230,assemblyType);
  }
  std::ifstream::~ifstream(local_230);
  return (bool)cVar1;
}

Assistant:

bool ExecutionEngine::loadAssembly(std::string filePath, AssemblyType assemblyType) {
		std::ios::openmode openMode = std::ios::in;

		if (filePath.find(".simg") != std::string::npos) {
			openMode = std::ios::binary;
		}

		std::ifstream fileStream(filePath, openMode);

		if (!fileStream.is_open()) {
			std::cout << "Could not load the assembly '" << filePath << "'." << std::endl;
			return false;
		}

		if (openMode == std::ios::binary) {
			loadImage(fileStream, assemblyType);
		} else {
			Loader::Assembly assembly(assemblyType == AssemblyType::Program ? "program": "library");
			Loader::load(fileStream, assembly);
			loadAssembly(assembly, assemblyType);
		}

		return true;
	}